

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall
wasm::TranslateToFuzzReader::fixAfterChanges(wasm::Function*)::Fixer::visitExpression(wasm::
Expression__(void *this,Expression *curr)

{
  Expression *curr_local;
  Fixer *this_local;
  
  BranchUtils::
  operateOnScopeNameDefs<wasm::TranslateToFuzzReader::fixAfterChanges(wasm::Function*)::Fixer::visitExpression(wasm::Expression*)::_lambda(wasm::Name&)_1_>
            (curr,(anon_class_8_1_8991fb9c)this);
  BranchUtils::
  operateOnScopeNameUses<wasm::TranslateToFuzzReader::fixAfterChanges(wasm::Function*)::Fixer::visitExpression(wasm::Expression*)::_lambda(wasm::Name&)_2_>
            (curr,(anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

void visitExpression(Expression* curr) {
      // Note all scope names, and fix up all uses.
      BranchUtils::operateOnScopeNameDefs(curr, [&](Name& name) {
        if (name.is()) {
          if (seen.count(name)) {
            replace();
          } else {
            seen.insert(name);
          }
        }
      });
      BranchUtils::operateOnScopeNameUses(curr, [&](Name& name) {
        if (name.is()) {
          replaceIfInvalid(name);
        }
      });
    }